

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::SCAtomTypesSectionParser::parseLine
          (SCAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  AtomType *pAVar3;
  RealType RVar4;
  string atomTypeName;
  SuttonChenAdapter sca;
  StringTokenizer tokenizer;
  string local_c8;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  SuttonChenAdapter local_88;
  StringTokenizer local_80;
  
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_80);
  if (iVar2 < 6) {
    snprintf(painCave.errMsg,2000,"SCAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_c8,&local_80);
    pAVar3 = ForceField::getAtomType(ff,&local_c8);
    if (pAVar3 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "SCAtomTypesSectionParser Error: Atom Type [%s] is not created yet\n",
               local_c8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_88.at_ = pAVar3;
      local_90 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_80);
      RVar4 = StringTokenizer::nextTokenAsDouble(&local_80);
      SuttonChenAdapter::makeSuttonChen
                (&local_88,local_98,local_a0,local_a8,
                 RVar4 * (this->options_->DistanceUnitScaling).data_,
                 local_90 * (this->options_->MetallicEnergyUnitScaling).data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SCAtomTypesSectionParser::parseLine(ForceField& ff,
                                           const std::string& line,
                                           int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in SCAtomTypesSectionParser, a line at least contains 6 tokens
    // atomTypeName, epsilon,c,m,n and alpha
    if (nTokens < 6) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SCAtomTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        SuttonChenAdapter sca = SuttonChenAdapter(atomType);

        RealType epsilon = tokenizer.nextTokenAsDouble();
        RealType c       = tokenizer.nextTokenAsDouble();
        RealType m       = tokenizer.nextTokenAsDouble();
        RealType n       = tokenizer.nextTokenAsDouble();
        RealType alpha   = tokenizer.nextTokenAsDouble();

        epsilon *= options_.getMetallicEnergyUnitScaling();
        alpha *= options_.getDistanceUnitScaling();

        sca.makeSuttonChen(c, m, n, alpha, epsilon);

      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "SCAtomTypesSectionParser Error: Atom Type [%s] is not created "
            "yet\n",
            atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }